

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::FeatureVectorizer::Clear(FeatureVectorizer *this)

{
  uint32_t cached_has_bits;
  FeatureVectorizer *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::Clear
            (&this->inputlist_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void FeatureVectorizer::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.FeatureVectorizer)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  inputlist_.Clear();
  _internal_metadata_.Clear<std::string>();
}